

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O1

Animation *
rw::Animation::create(AnimInterpolatorInfo *interpInfo,int32 numFrames,int32 flags,float duration)

{
  Animation *pAVar1;
  uint uVar2;
  
  uVar2 = interpInfo->animKeyFrameSize * numFrames + interpInfo->customDataSize + 0x28;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/anim.cpp line: 70"
  ;
  pAVar1 = (Animation *)(*Engine::memfuncs)((long)(int)uVar2,0x3001b);
  if (pAVar1 == (Animation *)0x0) {
    create((Animation *)(ulong)uVar2);
    pAVar1 = (Animation *)0x0;
  }
  else {
    pAVar1->interpInfo = interpInfo;
    pAVar1->numFrames = numFrames;
    pAVar1->flags = flags;
    pAVar1->duration = (float32)duration;
    pAVar1->keyframes = pAVar1 + 1;
    pAVar1->customData =
         (AnimInterpolatorInfo **)
         ((long)&pAVar1[1].interpInfo + (long)numFrames * (long)interpInfo->animKeyFrameSize);
  }
  return pAVar1;
}

Assistant:

Animation*
Animation::create(AnimInterpolatorInfo *interpInfo, int32 numFrames,
                  int32 flags, float duration)
{
	int32 sz = sizeof(Animation) +
	           numFrames*interpInfo->animKeyFrameSize +
	           interpInfo->customDataSize;
	uint8 *data = (uint8*)rwMalloc(sz, MEMDUR_EVENT | ID_ANIMANIMATION);
	if(data == nil){
		RWERROR((ERR_ALLOC, sz));
		return nil;
	}
	Animation *anim = (Animation*)data;
	data += sizeof(Animation);
	anim->interpInfo = interpInfo;
	anim->numFrames = numFrames;
	anim->flags = flags;
	anim->duration = duration;
	anim->keyframes = data;
	data += anim->numFrames*interpInfo->animKeyFrameSize;
	anim->customData = data;
	return anim;
}